

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.h
# Opt level: O0

void __thiscall cfd::core::ScriptOperator::~ScriptOperator(ScriptOperator *this)

{
  void *in_RDI;
  
  ~ScriptOperator((ScriptOperator *)0x210568);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

virtual ~ScriptOperator() {
    // do nothing
  }